

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::~t_rs_generator(t_rs_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_generator)._vptr_t_generator = (_func_int **)&PTR__t_rs_generator_00411b88;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_gen_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_gen_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x98);
  pcVar1 = (this->gen_dir_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->gen_dir_).field_2) {
    operator_delete(pcVar1);
  }
  t_generator::~t_generator(&this->super_t_generator);
  operator_delete(this);
  return;
}

Assistant:

t_rs_generator(
    t_program* program,
    const std::map<std::string, std::string>&,
    const std::string&
  ) : t_generator(program) {
    gen_dir_ = get_out_dir();
  }